

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *stream,Tag *tag)

{
  Tag maybeTag;
  long in_FS_OFFSET;
  quint32 value;
  Tag local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24.m_value = 0xaaaaaaaa;
  QDataStream::operator>>(stream,(int *)&local_24);
  if (local_24.m_value == 0) {
    QDataStream::setStatus((Status)stream);
  }
  else {
    tag->m_value = (quint32)local_24;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QFont::Tag &tag)
{
    quint32 value;
    stream >> value;
    if (const auto maybeTag = QFont::Tag::fromValue(value))
        tag = *maybeTag;
    else
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}